

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan.hpp
# Opt level: O3

bool duckdb::ReplacementScan::CanReplace
               (string *table_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *extensions)

{
  pointer pbVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  pointer __rhs;
  string lower_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  duckdb::StringUtil::Lower((string *)local_70);
  duckdb::CompressionExtensionFromType_abi_cxx11_((FileCompressionType)&local_b0);
  cVar2 = duckdb::StringUtil::EndsWith((string *)local_70,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (cVar2 == '\0') {
    duckdb::CompressionExtensionFromType_abi_cxx11_((FileCompressionType)&local_b0);
    cVar2 = duckdb::StringUtil::EndsWith((string *)local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (cVar2 == '\0') goto LAB_0028592c;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_70);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_70);
  }
  std::__cxx11::string::operator=((string *)local_70,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
LAB_0028592c:
  __rhs = (extensions->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (extensions->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs == pbVar1) {
    cVar2 = '\0';
  }
  else {
    do {
      std::operator+(&local_b0,".",__rhs);
      cVar3 = duckdb::StringUtil::EndsWith((string *)local_70,(string *)&local_b0);
      cVar2 = '\x01';
      if (cVar3 == '\0') {
        std::operator+(&local_50,".",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90 = &local_80;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_80 = *plVar5;
          lStack_78 = plVar4[3];
        }
        else {
          local_80 = *plVar5;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        cVar2 = duckdb::StringUtil::Contains((string *)local_70,(string *)&local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar1 && cVar2 == '\0');
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return (bool)cVar2;
}

Assistant:

static bool CanReplace(const string &table_name, const vector<string> &extensions) {
		auto lower_name = StringUtil::Lower(table_name);

		if (StringUtil::EndsWith(lower_name, CompressionExtensionFromType(FileCompressionType::GZIP))) {
			lower_name = lower_name.substr(0, lower_name.size() - 3);
		} else if (StringUtil::EndsWith(lower_name, CompressionExtensionFromType(FileCompressionType::ZSTD))) {
			lower_name = lower_name.substr(0, lower_name.size() - 4);
		}

		for (auto &extension : extensions) {
			if (StringUtil::EndsWith(lower_name, "." + extension) ||
			    StringUtil::Contains(lower_name, "." + extension + "?")) {
				return true;
			}
		}

		return false;
	}